

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall crnlib::dynamic_string::trim_crlf(dynamic_string *this)

{
  ushort uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->m_len;
  uVar4 = (ulong)(uint)uVar1;
  if (1 < uVar1) {
    uVar4 = (ulong)(uint)uVar1;
    do {
      if ((this->m_pStr[uVar4 - 1] != '\r') && (this->m_pStr[uVar4 - 1] != '\n')) goto LAB_00116f18;
      bVar2 = 2 < (long)uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
    uVar4 = 1;
  }
LAB_00116f18:
  if (uVar1 == 0) {
    clear(this);
  }
  else {
    uVar3 = (ulong)(uint)uVar1;
    if ((uint)uVar4 < (uint)uVar1) {
      uVar3 = uVar4 & 0xffffffff;
    }
    this->m_pStr[uVar3] = '\0';
    this->m_len = (uint16)uVar3;
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::trim_crlf()
    {
        int s = 0, e;

        for (e = m_len - 1; e > s; e--)
        {
            if ((m_pStr[e] != 13) && (m_pStr[e] != 10))
            {
                break;
            }
        }

        return crop(s, e - s + 1);
    }